

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile
          (FileGenerator *this,FileDescriptor *file,CrossFileReferences *refs)

{
  bool bVar1;
  Descriptor *d;
  FieldDescriptor *field;
  FileDescriptor *dep_00;
  int i_1;
  int i;
  int iVar2;
  btree_set<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *this_00;
  FileDescriptor *dep;
  FileDescriptor *local_58;
  btree_set<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_50;
  undefined1 local_48 [24];
  
  local_48._0_8_ = this;
  local_48._8_8_ = refs;
  for (iVar2 = 0; iVar2 < *(int *)(file + 0x3c); iVar2 = iVar2 + 1) {
    d = FileDescriptor::message_type(file,iVar2);
    ForEachField<true,google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
              (d,(anon_class_16_2_3fe543fb *)local_48);
  }
  for (iVar2 = 0; iVar2 < *(int *)(file + 4); iVar2 = iVar2 + 1) {
    field = FileDescriptor::extension(file,iVar2);
    GetCrossFileReferencesForFile::anon_class_16_2_3fe543fb::operator()
              ((anon_class_16_2_3fe543fb *)local_48,field);
  }
  bVar1 = HasDescriptorMethods(file,&this->options_);
  if (bVar1) {
    local_50 = &refs->weak_reflection_files;
    for (iVar2 = 0; iVar2 < *(int *)(file + 0x30); iVar2 = iVar2 + 1) {
      local_58 = (FileDescriptor *)google::protobuf::FileDescriptor::dependency((int)file);
      dep_00 = (FileDescriptor *)google::protobuf::FileDescriptor::dependency((int)file);
      bVar1 = ShouldSkipDependencyImports(this,dep_00);
      this_00 = &refs->strong_reflection_files;
      if ((!bVar1) || (bVar1 = IsDepWeak(this,local_58), this_00 = local_50, bVar1)) {
        absl::lts_20240722::container_internal::
        btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
        ::insert((pair<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>,_const_google::protobuf::FileDescriptor_*const_&,_const_google::protobuf::FileDescriptor_*const_*>,_bool>
                  *)local_48,
                 &this_00->
                  super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                 ,&local_58);
      }
    }
  }
  return;
}

Assistant:

void FileGenerator::GetCrossFileReferencesForFile(const FileDescriptor* file,
                                                  CrossFileReferences* refs) {
  ForEachField(file, [this, refs](const FieldDescriptor* field) {
    GetCrossFileReferencesForField(field, refs);
  });

  if (!HasDescriptorMethods(file, options_)) {
    return;
  }

  for (int i = 0; i < file->dependency_count(); ++i) {
    const FileDescriptor* dep = file->dependency(i);

    if (!ShouldSkipDependencyImports(file->dependency(i))) {
      refs->strong_reflection_files.insert(dep);
    } else if (IsDepWeak(dep)) {
      refs->weak_reflection_files.insert(dep);
    }
  }
}